

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollFromPosY(ImGuiWindow *window,float local_y,float center_y_ratio)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float decoration_up_height;
  
  if (in_XMM1_Da < 0.0 || 1.0 < in_XMM1_Da) {
    __assert_fail("center_y_ratio >= 0.0f && center_y_ratio <= 1.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1d3a,"void ImGui::SetScrollFromPosY(ImGuiWindow *, float, float)");
  }
  fVar1 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
  fVar2 = ImGuiWindow::MenuBarHeight((ImGuiWindow *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
  *(float *)(in_RDI + 0x68) =
       (float)(int)((in_XMM0_Da - (fVar1 + fVar2)) + *(float *)(in_RDI + 0x58));
  *(float *)(in_RDI + 0x70) = in_XMM1_Da;
  return;
}

Assistant:

void ImGui::SetScrollFromPosY(ImGuiWindow* window, float local_y, float center_y_ratio)
{
    // We store a target position so centering can occur on the next frame when we are guaranteed to have a known window size
    IM_ASSERT(center_y_ratio >= 0.0f && center_y_ratio <= 1.0f);
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
    local_y -= decoration_up_height;
    window->ScrollTarget.y = IM_FLOOR(local_y + window->Scroll.y);
    window->ScrollTargetCenterRatio.y = center_y_ratio;
}